

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_message.c
# Opt level: O0

CMimeMessage_T * cmime_message_new(void)

{
  int iVar1;
  CMimeStringList_T *pCVar2;
  CMimeMessage_T *message;
  
  message = (CMimeMessage_T *)calloc(1,0x40);
  iVar1 = cmime_list_new(&message->headers,_cmime_internal_header_destroy);
  if (iVar1 == 0) {
    message->sender = (CMimeAddress_T *)0x0;
    iVar1 = cmime_list_new(&message->recipients,_recipients_destroy);
    if (iVar1 == 0) {
      message->boundary = (char *)0x0;
      message->gap = (char *)0x0;
      message->linebreak = (char *)0x0;
      iVar1 = cmime_list_new(&message->parts,_cmime_internal_parts_destroy);
      if (iVar1 == 0) {
        pCVar2 = cmime_string_list_new();
        message->boundaries = pCVar2;
      }
      else {
        free(message);
        message = (CMimeMessage_T *)0x0;
      }
    }
    else {
      free(message);
      message = (CMimeMessage_T *)0x0;
    }
  }
  else {
    free(message);
    message = (CMimeMessage_T *)0x0;
  }
  return message;
}

Assistant:

CMimeMessage_T *cmime_message_new(void) {
    CMimeMessage_T *message = NULL;
    
    message = (CMimeMessage_T *)calloc((size_t)1, sizeof(CMimeMessage_T));

    if (cmime_list_new(&message->headers,_cmime_internal_header_destroy)!=0) {
        free(message);
        return(NULL);
    }
    
    message->sender = NULL;
    if (cmime_list_new(&message->recipients,_recipients_destroy)!=0) {
        free(message);
        return(NULL);
    }

    message->boundary = NULL;
    message->gap = NULL;
    message->linebreak = NULL;

    if (cmime_list_new(&message->parts,_cmime_internal_parts_destroy)!=0)  {
        free(message);
        return(NULL);
    }


    message->boundaries = cmime_string_list_new();
    return(message);
}